

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O2

bool __thiscall iDynTree::optimalcontrol::TimeRange::operator==(TimeRange *this,TimeRange *rhs)

{
  char cVar1;
  undefined1 uVar2;
  double local_28;
  double local_20;
  
  if (((this->m_anyTime | rhs->m_anyTime) & 1U) != 0) {
    return (bool)(this->m_anyTime & rhs->m_anyTime);
  }
  local_20 = rhs->m_initTime;
  cVar1 = iDynTree::checkDoublesAreEqual(&this->m_initTime,&local_20,DEFAULT_TOL);
  if (cVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    local_28 = rhs->m_endTime;
    uVar2 = iDynTree::checkDoublesAreEqual(&this->m_endTime,&local_28,DEFAULT_TOL);
  }
  return (bool)uVar2;
}

Assistant:

bool TimeRange::operator==(const TimeRange &rhs) const
        {
            if (this->m_anyTime && rhs.m_anyTime) {
                return true;
            }

            if (rhs.m_anyTime) {
                return false;
            }

            if (this ->m_anyTime) {
                return false;
            }

            return (checkDoublesAreEqual(this->m_initTime, rhs.initTime()) && checkDoublesAreEqual(this->m_endTime, rhs.endTime()));//((this->m_initTime == rhs.initTime())&&(this->m_endTime == rhs.endTime()));
        }